

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  long lVar4;
  ActivationLinear *pAVar5;
  ulong uVar6;
  bool bVar7;
  LogMessage *other;
  long *plVar8;
  size_type *psVar9;
  undefined1 *puVar10;
  Result *_result;
  string err;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_0035b1d1;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Slice","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_88,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  paVar1 = &local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity =
       local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (layer->_oneof_case_[0] == 0x15e) {
    puVar10 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar10 = Specification::_SliceLayerParams_default_instance_;
  }
  uVar2 = (((ConvolutionLayerParams *)puVar10)->stride_).current_size_;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  if (uVar2 < 3) {
    bVar7 = true;
    if (*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24)
        <= (int)(2 - uVar2)) {
      plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      lVar4 = *plVar8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,lVar4,plVar8[1] + lVar4);
      std::operator+(&local_a8,"Slice layer \'",&local_c8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
      goto LAB_0035b104;
    }
  }
  else {
    plVar8 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    lVar4 = *plVar8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,lVar4,plVar8[1] + lVar4);
    std::operator+(&local_a8,"Slice layer: \'",&local_c8);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
LAB_0035b104:
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_e8.field_2._M_allocated_capacity = *psVar9;
      local_e8.field_2._8_8_ = plVar8[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar9;
      local_e8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_e8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
LAB_0035b1d1:
  if (layer->_oneof_case_[0] == 0x15e) {
    puVar10 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar10 = Specification::_SliceLayerParams_default_instance_;
  }
  if ((((SliceDynamicLayerParams *)puVar10)->endids_).current_size_ < 1) {
    std::operator+(&local_e8,"Stride length for the slice layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_108.field_2._M_allocated_capacity = *psVar9;
      local_108.field_2._8_8_ = plVar8[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar9;
      local_108._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_108._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
  }
  else {
    pAVar5 = (((ActivationParams *)puVar10)->NonlinearityType_).linear_;
    uVar6 = ((SliceLayerParams *)puVar10)->endindex_;
    if (((long)uVar6 < 1 || (long)pAVar5 <= (long)uVar6) &&
       (-1 < (long)(uVar6 & (ulong)pAVar5) || (long)pAVar5 <= (long)uVar6)) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_e8,"Slice layer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_108.field_2._M_allocated_capacity = *psVar9;
      local_108.field_2._8_8_ = plVar8[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar9;
      local_108._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_108._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Slice", blobNameToRank));
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.slice().axis()) {
            case Specification::SliceLayerParams_SliceAxis_CHANNEL_AXIS:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_HEIGHT_AXIS:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_WIDTH_AXIS:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            default:
                err = "Slice layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Slice layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimension provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    const auto& slice = layer.slice();
    int stride = static_cast<int>(slice.stride());
    if (stride < 1) {
        std::string err = "Stride length for the slice layer '" + layer.name() + "' must be > 1.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    int64_t start = (int64_t)slice.startindex();
    int64_t end = slice.endindex();
    if ((end > 0 && end < start )
        || (end < 0 && start < 0 && start > end)) {
        std::string err = "Slice layer " + layer.name() + " has an end index before the start index.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}